

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O2

void ncnn::conv_im2col_sgemm_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,int kernel_w,int kernel_h,
               int stride_w,int stride_h,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  void *pvVar19;
  size_t sVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined8 uVar37;
  void *pvVar38;
  void *pvVar39;
  size_t sVar40;
  int _c;
  int iVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  int _h;
  int iVar48;
  uint uVar49;
  undefined8 *puVar50;
  ulong uVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  ulong uVar57;
  float *pfVar58;
  int iVar59;
  float *pfVar60;
  float *pfVar61;
  uint uVar62;
  int iVar63;
  ulong uVar64;
  float *pfVar65;
  float *pfVar66;
  bool bVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float *local_190;
  Mat local_188;
  ulong local_148;
  uint local_13c;
  ulong local_138;
  long local_130;
  undefined8 local_128;
  float fStack_120;
  float fStack_11c;
  Mat bottom_tm;
  int stride;
  Mat bottom_im2col;
  float zeros [4];
  
  local_148 = CONCAT44(local_148._4_4_,bottom_blob->w);
  iVar42 = bottom_blob->c;
  uVar49 = top_blob->w;
  iVar43 = top_blob->h;
  pvVar19 = _bias->data;
  uVar62 = iVar43 * uVar49;
  iVar59 = kernel_h * kernel_w;
  _h = iVar42 * iVar59;
  sVar20 = bottom_blob->elemsize;
  iVar18 = top_blob->c;
  local_130._0_4_ = kernel_h;
  Mat::Mat(&bottom_im2col,uVar62,_h,sVar20,opt->workspace_allocator);
  pvVar38 = bottom_im2col.data;
  uVar57 = 0;
  uVar64 = (ulong)uVar49;
  if ((int)uVar49 < 1) {
    uVar64 = uVar57;
  }
  if (iVar43 < 1) {
    iVar43 = 0;
  }
  if (kernel_w < 1) {
    kernel_w = 0;
  }
  if ((int)local_130 < 1) {
    local_130._0_4_ = 0;
  }
  iVar63 = 0;
  if (0 < iVar42) {
    iVar63 = iVar42;
  }
  local_138 = CONCAT44(local_138._4_4_,iVar63);
  iVar63 = stride_h * (int)local_148;
  local_13c = uVar62;
  while( true ) {
    uVar49 = local_13c;
    _c = (int)uVar57;
    if (_c == (int)local_138) break;
    Mat::channel(&bottom_tm,bottom_blob,_c);
    pvVar39 = bottom_tm.data;
    Mat::~Mat(&bottom_tm);
    iVar41 = uVar62 * iVar59 * _c;
    iVar54 = 0;
    for (iVar48 = 0; iVar48 != (int)local_130; iVar48 = iVar48 + 1) {
      local_128 = (float *)CONCAT44(local_128._4_4_,iVar54);
      iVar53 = iVar54;
      for (iVar52 = 0; iVar52 != kernel_w; iVar52 = iVar52 + 1) {
        iVar56 = iVar53;
        for (iVar55 = 0; iVar55 != iVar43; iVar55 = iVar55 + 1) {
          iVar45 = iVar56;
          for (uVar57 = 0; uVar64 != uVar57; uVar57 = uVar57 + 1) {
            *(undefined4 *)((long)pvVar38 + uVar57 * 4 + (long)iVar41 * 4) =
                 *(undefined4 *)((long)pvVar39 + (long)iVar45 * 4);
            iVar45 = iVar45 + stride_w;
          }
          iVar41 = iVar41 + (int)uVar57;
          iVar56 = iVar56 + iVar63;
        }
        iVar53 = iVar53 + 1;
      }
      iVar54 = iVar54 + (int)local_148;
    }
    uVar57 = (ulong)(_c + 1);
  }
  Mat::Mat(&bottom_tm,iVar59 * 4,iVar42,((int)local_13c / 4) * -3 + local_13c,sVar20,
           opt->workspace_allocator);
  uVar62 = (int)uVar49 >> 2;
  lVar46 = (long)(int)uVar49;
  pfVar61 = (float *)0x0;
  iVar42 = 0;
  if (0 < _h) {
    iVar42 = _h;
  }
  local_148 = CONCAT44(local_148._4_4_,iVar42);
  local_128 = (float *)(ulong)uVar62;
  if ((int)uVar62 < 1) {
    local_128 = pfVar61;
  }
  local_130 = lVar46;
  for (pfVar66 = (float *)0x0; pvVar38 = bottom_im2col.data, pfVar66 != local_128;
      pfVar66 = (float *)((long)pfVar66 + 1)) {
    local_188.data = bottom_im2col.data;
    local_188.refcount = (int *)0x0;
    local_188.elemsize = bottom_im2col.elemsize;
    local_188.elempack = bottom_im2col.elempack;
    local_188.allocator = bottom_im2col.allocator;
    local_188.w = bottom_im2col.w;
    local_188.h = bottom_im2col.h;
    local_188.cstep = (size_t)(bottom_im2col.h * bottom_im2col.w);
    local_188.dims = 2;
    local_188.c = 1;
    Mat::~Mat(&local_188);
    pfVar60 = (float *)(bottom_tm.cstep * (long)pfVar66 * bottom_tm.elemsize + (long)bottom_tm.data)
    ;
    local_188.refcount = (int *)0x0;
    local_188.elemsize = bottom_tm.elemsize;
    local_188.elempack = bottom_tm.elempack;
    local_188.allocator = bottom_tm.allocator;
    local_188.w = bottom_tm.w;
    local_188.h = bottom_tm.h;
    local_188.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
    local_188.data = pfVar60;
    local_188.dims = 2;
    local_188.c = 1;
    Mat::~Mat(&local_188);
    puVar50 = (undefined8 *)((long)pvVar38 + (long)pfVar61);
    iVar42 = (int)local_148;
    while (bVar67 = iVar42 != 0, iVar42 = iVar42 + -1, bVar67) {
      uVar37 = puVar50[1];
      *(undefined8 *)pfVar60 = *puVar50;
      *(undefined8 *)(pfVar60 + 2) = uVar37;
      pfVar60 = pfVar60 + 4;
      puVar50 = (undefined8 *)((long)puVar50 + lVar46 * 4);
    }
    pfVar61 = pfVar61 + 4;
  }
  uVar64 = (ulong)(int)(local_13c & 0xfffffffc);
  iVar42 = (int)local_148;
  lVar47 = uVar64 * 4;
  for (; pvVar38 = bottom_im2col.data, (long)uVar64 < local_130; uVar64 = uVar64 + 1) {
    local_188.data = bottom_im2col.data;
    local_188.refcount = (int *)0x0;
    local_188.elemsize = bottom_im2col.elemsize;
    local_188.elempack = bottom_im2col.elempack;
    local_188.allocator = bottom_im2col.allocator;
    local_188.w = bottom_im2col.w;
    local_188.h = bottom_im2col.h;
    local_188.c = 1;
    local_188.cstep = (size_t)(bottom_im2col.h * bottom_im2col.w);
    local_188.dims = 2;
    Mat::~Mat(&local_188);
    uVar57 = (ulong)(uint)((int)uVar64 >> 0x1f) << 0x20 | uVar64 & 0xffffffff;
    pfVar61 = (float *)((long)((int)((long)uVar57 % 4) + (int)((long)uVar57 / 4)) * bottom_tm.cstep
                        * bottom_tm.elemsize + (long)bottom_tm.data);
    local_188.refcount = (int *)0x0;
    local_188.elemsize = bottom_tm.elemsize;
    local_188.elempack = bottom_tm.elempack;
    local_188.allocator = bottom_tm.allocator;
    local_188.w = bottom_tm.w;
    local_188.h = bottom_tm.h;
    local_188.c = 1;
    local_188.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
    local_188.data = pfVar61;
    local_188.dims = 2;
    Mat::~Mat(&local_188);
    pfVar66 = (float *)((long)pvVar38 + lVar47);
    for (lVar44 = 0; iVar42 != (int)lVar44; lVar44 = lVar44 + 1) {
      pfVar61[lVar44] = *pfVar66;
      pfVar66 = pfVar66 + lVar46;
    }
    lVar47 = lVar47 + 4;
  }
  local_138 = (long)iVar18 & 0xfffffffffffffffc;
  uVar57 = 0;
  uVar64 = (ulong)(uint)(iVar18 >> 2);
  if (iVar18 >> 2 < 1) {
    uVar64 = uVar57;
  }
  while (uVar51 = local_138, uVar57 != uVar64) {
    uVar49 = (int)uVar57 * 4;
    Mat::channel(&local_188,top_blob,uVar49);
    local_190 = (float *)local_188.data;
    Mat::~Mat(&local_188);
    Mat::channel(&local_188,top_blob,uVar49 | 1);
    pvVar38 = local_188.data;
    Mat::~Mat(&local_188);
    Mat::channel(&local_188,top_blob,uVar49 | 2);
    pfVar61 = (float *)local_188.data;
    local_128 = (float *)pvVar38;
    Mat::~Mat(&local_188);
    Mat::channel(&local_188,top_blob,uVar49 | 3);
    pfVar66 = (float *)local_188.data;
    Mat::~Mat(&local_188);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    pfVar60 = (float *)((long)pvVar19 + uVar57 * 0x10);
    if (pvVar19 == (void *)0x0) {
      pfVar60 = zeros;
    }
    local_148 = uVar57;
    for (uVar51 = 0; uVar57 = local_148, (long)(uVar51 | 3) < local_130; uVar51 = uVar51 + 4) {
      pfVar65 = (float *)((uVar51 >> 2) * bottom_tm.cstep * bottom_tm.elemsize +
                         (long)bottom_tm.data);
      local_188.refcount = (int *)0x0;
      local_188.elemsize = bottom_tm.elemsize;
      local_188.elempack = bottom_tm.elempack;
      local_188.allocator = bottom_tm.allocator;
      local_188.dims = 2;
      local_188.w = bottom_tm.w;
      local_188.h = bottom_tm.h;
      local_188.c = 1;
      local_188.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
      local_188.data = pfVar65;
      Mat::~Mat(&local_188);
      Mat::channel(&local_188,kernel_tm,(int)uVar57);
      pfVar58 = (float *)local_188.data;
      Mat::~Mat(&local_188);
      fVar68 = *pfVar60;
      fVar72 = pfVar60[1];
      fVar76 = pfVar60[2];
      fVar80 = pfVar60[3];
      fVar69 = fVar68;
      fVar70 = fVar68;
      fVar71 = fVar68;
      fVar73 = fVar72;
      fVar74 = fVar72;
      fVar75 = fVar72;
      fVar77 = fVar76;
      fVar78 = fVar76;
      fVar79 = fVar76;
      fVar81 = fVar80;
      fVar82 = fVar80;
      fVar83 = fVar80;
      for (iVar42 = 0; iVar42 + 3 < _h; iVar42 = iVar42 + 4) {
        fVar2 = *pfVar58;
        fVar3 = pfVar58[1];
        fVar4 = pfVar58[2];
        fVar5 = pfVar58[3];
        fVar21 = *pfVar65;
        fVar22 = pfVar65[1];
        fVar23 = pfVar65[2];
        fVar24 = pfVar65[3];
        fVar25 = pfVar65[4];
        fVar26 = pfVar65[5];
        fVar27 = pfVar65[6];
        fVar28 = pfVar65[7];
        fVar29 = pfVar65[8];
        fVar30 = pfVar65[9];
        fVar31 = pfVar65[10];
        fVar32 = pfVar65[0xb];
        fVar33 = pfVar65[0xc];
        fVar34 = pfVar65[0xd];
        fVar35 = pfVar65[0xe];
        fVar36 = pfVar65[0xf];
        fVar6 = pfVar58[4];
        fVar7 = pfVar58[5];
        fVar8 = pfVar58[6];
        fVar9 = pfVar58[7];
        fVar10 = pfVar58[8];
        fVar11 = pfVar58[9];
        fVar12 = pfVar58[10];
        fVar13 = pfVar58[0xb];
        fVar14 = pfVar58[0xc];
        fVar15 = pfVar58[0xd];
        fVar16 = pfVar58[0xe];
        fVar17 = pfVar58[0xf];
        fVar68 = fVar14 * fVar33 + fVar10 * fVar29 + fVar6 * fVar25 + fVar2 * fVar21 + fVar68;
        fVar69 = fVar14 * fVar34 + fVar10 * fVar30 + fVar6 * fVar26 + fVar2 * fVar22 + fVar69;
        fVar70 = fVar14 * fVar35 + fVar10 * fVar31 + fVar6 * fVar27 + fVar2 * fVar23 + fVar70;
        fVar71 = fVar14 * fVar36 + fVar10 * fVar32 + fVar6 * fVar28 + fVar2 * fVar24 + fVar71;
        fVar72 = fVar15 * fVar33 + fVar11 * fVar29 + fVar7 * fVar25 + fVar3 * fVar21 + fVar72;
        fVar73 = fVar15 * fVar34 + fVar11 * fVar30 + fVar7 * fVar26 + fVar3 * fVar22 + fVar73;
        fVar74 = fVar15 * fVar35 + fVar11 * fVar31 + fVar7 * fVar27 + fVar3 * fVar23 + fVar74;
        fVar75 = fVar15 * fVar36 + fVar11 * fVar32 + fVar7 * fVar28 + fVar3 * fVar24 + fVar75;
        fVar76 = fVar16 * fVar33 + fVar12 * fVar29 + fVar8 * fVar25 + fVar4 * fVar21 + fVar76;
        fVar77 = fVar16 * fVar34 + fVar12 * fVar30 + fVar8 * fVar26 + fVar4 * fVar22 + fVar77;
        fVar78 = fVar16 * fVar35 + fVar12 * fVar31 + fVar8 * fVar27 + fVar4 * fVar23 + fVar78;
        fVar79 = fVar16 * fVar36 + fVar12 * fVar32 + fVar8 * fVar28 + fVar4 * fVar24 + fVar79;
        fVar80 = fVar17 * fVar33 + fVar13 * fVar29 + fVar9 * fVar25 + fVar5 * fVar21 + fVar80;
        fVar81 = fVar17 * fVar34 + fVar13 * fVar30 + fVar9 * fVar26 + fVar5 * fVar22 + fVar81;
        fVar82 = fVar17 * fVar35 + fVar13 * fVar31 + fVar9 * fVar27 + fVar5 * fVar23 + fVar82;
        fVar83 = fVar17 * fVar36 + fVar13 * fVar32 + fVar9 * fVar28 + fVar5 * fVar24 + fVar83;
        pfVar58 = pfVar58 + 0x10;
        pfVar65 = pfVar65 + 0x10;
      }
      lVar46 = 0;
      for (; iVar42 < _h; iVar42 = iVar42 + 1) {
        pfVar1 = (float *)((long)pfVar65 + lVar46);
        fVar6 = *pfVar1;
        fVar7 = pfVar1[1];
        fVar8 = pfVar1[2];
        fVar9 = pfVar1[3];
        fVar2 = *(float *)((long)pfVar58 + lVar46);
        fVar3 = *(float *)((long)pfVar58 + lVar46 + 4);
        fVar4 = *(float *)((long)pfVar58 + lVar46 + 8);
        fVar5 = *(float *)((long)pfVar58 + lVar46 + 0xc);
        fVar68 = fVar68 + fVar2 * fVar6;
        fVar69 = fVar69 + fVar2 * fVar7;
        fVar70 = fVar70 + fVar2 * fVar8;
        fVar71 = fVar71 + fVar2 * fVar9;
        fVar72 = fVar72 + fVar3 * fVar6;
        fVar73 = fVar73 + fVar3 * fVar7;
        fVar74 = fVar74 + fVar3 * fVar8;
        fVar75 = fVar75 + fVar3 * fVar9;
        fVar76 = fVar76 + fVar4 * fVar6;
        fVar77 = fVar77 + fVar4 * fVar7;
        fVar78 = fVar78 + fVar4 * fVar8;
        fVar79 = fVar79 + fVar4 * fVar9;
        fVar80 = fVar80 + fVar5 * fVar6;
        fVar81 = fVar81 + fVar5 * fVar7;
        fVar82 = fVar82 + fVar5 * fVar8;
        fVar83 = fVar83 + fVar5 * fVar9;
        lVar46 = lVar46 + 0x10;
      }
      *local_190 = fVar68;
      local_190[1] = fVar69;
      local_190[2] = fVar70;
      local_190[3] = fVar71;
      *local_128 = fVar72;
      local_128[1] = fVar73;
      local_128[2] = fVar74;
      local_128[3] = fVar75;
      *pfVar61 = fVar76;
      pfVar61[1] = fVar77;
      pfVar61[2] = fVar78;
      pfVar61[3] = fVar79;
      *pfVar66 = fVar80;
      pfVar66[1] = fVar81;
      pfVar66[2] = fVar82;
      pfVar66[3] = fVar83;
      local_190 = local_190 + 4;
      local_128 = local_128 + 4;
      pfVar61 = pfVar61 + 4;
      pfVar66 = pfVar66 + 4;
    }
    while (uVar57 = local_148, uVar49 = (uint)uVar51, (int)uVar49 < (int)local_13c) {
      pfVar65 = (float *)(((uVar49 & 3) + ((uint)(uVar51 >> 2) & 0x3fffffff)) * bottom_tm.cstep *
                          bottom_tm.elemsize + (long)bottom_tm.data);
      local_188.refcount = (int *)0x0;
      local_188.elemsize = bottom_tm.elemsize;
      local_188.elempack = bottom_tm.elempack;
      local_188.allocator = bottom_tm.allocator;
      local_188.dims = 2;
      local_188.w = bottom_tm.w;
      local_188.h = bottom_tm.h;
      local_188.c = 1;
      local_188.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
      local_188.data = pfVar65;
      Mat::~Mat(&local_188);
      Mat::channel(&local_188,kernel_tm,(int)uVar57);
      pfVar58 = (float *)local_188.data;
      Mat::~Mat(&local_188);
      fVar74 = 0.0;
      fVar75 = 0.0;
      fVar77 = 0.0;
      fVar78 = 0.0;
      fVar68 = 0.0;
      fVar76 = 0.0;
      fVar69 = 0.0;
      fVar71 = 0.0;
      fVar79 = 0.0;
      fVar81 = 0.0;
      fVar82 = 0.0;
      fVar83 = 0.0;
      fVar72 = 0.0;
      fVar80 = 0.0;
      fVar70 = 0.0;
      fVar73 = 0.0;
      for (iVar42 = 0; iVar42 + 3 < _h; iVar42 = iVar42 + 4) {
        fVar2 = *pfVar65;
        fVar3 = pfVar65[1];
        fVar4 = pfVar65[2];
        fVar5 = pfVar65[3];
        fVar74 = fVar74 + *pfVar58 * fVar2;
        fVar75 = fVar75 + pfVar58[1] * fVar2;
        fVar77 = fVar77 + pfVar58[2] * fVar2;
        fVar78 = fVar78 + pfVar58[3] * fVar2;
        fVar68 = fVar68 + pfVar58[4] * fVar3;
        fVar76 = fVar76 + pfVar58[5] * fVar3;
        fVar69 = fVar69 + pfVar58[6] * fVar3;
        fVar71 = fVar71 + pfVar58[7] * fVar3;
        fVar79 = fVar79 + pfVar58[8] * fVar4;
        fVar81 = fVar81 + pfVar58[9] * fVar4;
        fVar82 = fVar82 + pfVar58[10] * fVar4;
        fVar83 = fVar83 + pfVar58[0xb] * fVar4;
        fVar72 = fVar72 + pfVar58[0xc] * fVar5;
        fVar80 = fVar80 + pfVar58[0xd] * fVar5;
        fVar70 = fVar70 + pfVar58[0xe] * fVar5;
        fVar73 = fVar73 + pfVar58[0xf] * fVar5;
        pfVar58 = pfVar58 + 0x10;
        pfVar65 = pfVar65 + 4;
      }
      fVar72 = fVar68 + fVar79 + fVar74 + *pfVar60 + fVar72;
      fVar80 = fVar76 + fVar81 + fVar75 + pfVar60[1] + fVar80;
      fVar70 = fVar69 + fVar82 + fVar77 + pfVar60[2] + fVar70;
      fVar73 = fVar71 + fVar83 + fVar78 + pfVar60[3] + fVar73;
      lVar46 = 0;
      for (; iVar42 < _h; iVar42 = iVar42 + 1) {
        fVar68 = *(float *)((long)pfVar65 + lVar46);
        pfVar1 = pfVar58 + lVar46;
        fVar72 = fVar72 + *pfVar1 * fVar68;
        fVar80 = fVar80 + pfVar1[1] * fVar68;
        fVar70 = fVar70 + pfVar1[2] * fVar68;
        fVar73 = fVar73 + pfVar1[3] * fVar68;
        lVar46 = lVar46 + 4;
      }
      *local_190 = fVar72;
      *local_128 = fVar80;
      *pfVar61 = fVar70;
      *pfVar66 = fVar73;
      local_190 = local_190 + 1;
      local_128 = local_128 + 1;
      pfVar61 = pfVar61 + 1;
      pfVar66 = pfVar66 + 1;
      uVar51 = (ulong)(uVar49 + 1);
    }
    uVar57 = local_148 + 1;
  }
  while ((long)uVar51 < (long)iVar18) {
    local_138 = uVar51;
    Mat::channel(&local_188,top_blob,(int)uVar51);
    pfVar61 = (float *)local_188.data;
    Mat::~Mat(&local_188);
    if (pvVar19 == (void *)0x0) {
      fVar68 = 0.0;
    }
    else {
      fVar68 = *(float *)((long)pvVar19 + local_138 * 4);
    }
    iVar42 = (int)((long)((ulong)(uint)((int)local_138 >> 0x1f) << 0x20 | local_138 & 0xffffffff) /
                  4) * -3 + (int)local_138;
    local_128 = (float *)CONCAT44(fVar68,fVar68);
    fStack_120 = fVar68;
    fStack_11c = fVar68;
    for (uVar64 = 0; (long)(uVar64 | 3) < local_130; uVar64 = uVar64 + 4) {
      pfVar60 = (float *)((uVar64 >> 2) * bottom_tm.cstep * bottom_tm.elemsize +
                         (long)bottom_tm.data);
      local_188.refcount = (int *)0x0;
      local_188.elemsize = bottom_tm.elemsize;
      local_188.elempack = bottom_tm.elempack;
      local_188.allocator = bottom_tm.allocator;
      local_188.dims = 2;
      local_188.w = bottom_tm.w;
      local_188.h = bottom_tm.h;
      local_188.c = 1;
      local_188.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
      local_188.data = pfVar60;
      Mat::~Mat(&local_188);
      Mat::channel(&local_188,kernel_tm,iVar42);
      pfVar66 = (float *)local_188.data;
      Mat::~Mat(&local_188);
      fVar72 = (float)local_128;
      fVar76 = local_128._4_4_;
      fVar80 = fStack_120;
      fVar69 = fStack_11c;
      for (iVar43 = 0; iVar43 + 3 < _h; iVar43 = iVar43 + 4) {
        fVar70 = *pfVar66;
        fVar71 = pfVar66[1];
        fVar73 = pfVar66[2];
        fVar74 = pfVar66[3];
        fVar72 = *pfVar60 * fVar70 + fVar72 + pfVar60[8] * fVar73 + pfVar60[4] * fVar71 +
                 pfVar60[0xc] * fVar74;
        fVar76 = pfVar60[1] * fVar70 + fVar76 + pfVar60[9] * fVar73 + pfVar60[5] * fVar71 +
                 pfVar60[0xd] * fVar74;
        fVar80 = pfVar60[2] * fVar70 + fVar80 + pfVar60[10] * fVar73 + pfVar60[6] * fVar71 +
                 pfVar60[0xe] * fVar74;
        fVar69 = pfVar60[3] * fVar70 + fVar69 + pfVar60[0xb] * fVar73 + pfVar60[7] * fVar71 +
                 pfVar60[0xf] * fVar74;
        pfVar66 = pfVar66 + 4;
        pfVar60 = pfVar60 + 0x10;
      }
      lVar46 = 0;
      for (; iVar43 < _h; iVar43 = iVar43 + 1) {
        fVar70 = *(float *)((long)pfVar66 + lVar46);
        pfVar58 = pfVar60 + lVar46;
        fVar72 = fVar72 + *pfVar58 * fVar70;
        fVar76 = fVar76 + pfVar58[1] * fVar70;
        fVar80 = fVar80 + pfVar58[2] * fVar70;
        fVar69 = fVar69 + pfVar58[3] * fVar70;
        lVar46 = lVar46 + 4;
      }
      *pfVar61 = fVar72;
      pfVar61[1] = fVar76;
      pfVar61[2] = fVar80;
      pfVar61[3] = fVar69;
      pfVar61 = pfVar61 + 4;
    }
    while( true ) {
      sVar40 = bottom_tm.cstep;
      sVar20 = bottom_tm.elemsize;
      pvVar38 = bottom_tm.data;
      if ((int)local_13c <= (int)(uint)uVar64) break;
      uVar57 = (ulong)(((uint)uVar64 & 3) + ((uint)(uVar64 >> 2) & 0x3fffffff));
      pfVar66 = (float *)(uVar57 * bottom_tm.cstep * bottom_tm.elemsize + (long)bottom_tm.data);
      local_188.refcount = (int *)0x0;
      local_188.elemsize = bottom_tm.elemsize;
      local_188.elempack = bottom_tm.elempack;
      local_188.allocator = bottom_tm.allocator;
      local_188.dims = 2;
      local_188.w = bottom_tm.w;
      local_188.h = bottom_tm.h;
      local_188.c = 1;
      local_188.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
      local_188.data = pfVar66;
      local_148 = uVar64;
      local_128 = pfVar61;
      Mat::~Mat(&local_188);
      Mat::channel(&local_188,kernel_tm,iVar42);
      pvVar39 = local_188.data;
      Mat::~Mat(&local_188);
      fVar72 = 0.0;
      fVar76 = 0.0;
      fVar80 = 0.0;
      fVar69 = 0.0;
      lVar46 = 0;
      pfVar61 = (float *)pvVar39;
      for (iVar43 = 0; iVar43 + 3 < _h; iVar43 = iVar43 + 4) {
        fVar72 = fVar72 + *pfVar61 * *pfVar66;
        fVar76 = fVar76 + pfVar61[1] * pfVar66[1];
        fVar80 = fVar80 + pfVar61[2] * pfVar66[2];
        fVar69 = fVar69 + pfVar61[3] * pfVar66[3];
        pfVar61 = pfVar61 + 4;
        pfVar66 = pfVar66 + 4;
        lVar46 = lVar46 + 4;
      }
      fVar72 = fVar69 + fVar76 + fVar80 + fVar72 + fVar68;
      for (; (int)lVar46 < _h; lVar46 = lVar46 + 1) {
        fVar72 = fVar72 + *(float *)((long)pvVar38 + lVar46 * 4 + sVar40 * sVar20 * uVar57) *
                          *(float *)((long)pvVar39 + lVar46 * 4);
      }
      *local_128 = fVar72;
      pfVar61 = local_128 + 1;
      uVar64 = (ulong)((int)local_148 + 1);
    }
    uVar51 = local_138 + 1;
  }
  Mat::~Mat(&bottom_tm);
  Mat::~Mat(&bottom_im2col);
  return;
}

Assistant:

static void conv_im2col_sgemm_sse(const Mat &bottom_blob, Mat &top_blob, const Mat & kernel_tm, const Mat& _bias, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    // im2col
    Mat bottom_im2col(outw*outh, kernel_h*kernel_w*inch, elemsize, opt.workspace_allocator);
    {
        const int stride = kernel_h*kernel_w*outw*outh;
        float* ret = (float*)bottom_im2col;
    
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<inch; p++)
        {
            const float* input = bottom_blob.channel(p);
            int retID = stride * p;
            for (int u=0; u<kernel_h; u++)
            {
                for (int v=0; v<kernel_w; v++)
                {
                    for (int i=0; i<outh; i++)
                    {
                        for (int j=0; j<outw; j++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // bottom_im2col memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, elemsize, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i/4);

            for (int q=0; q<inch*kernel_size; q++)
            {
#if __SSE__
                _mm_storeu_ps(tmpptr, _mm_loadu_ps(img0));
#else                
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img0[2];
                tmpptr[3] = img0[3];
#endif // __SSE__              
                tmpptr += 4;
                img0 += out_size;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i/4 + i%4);

            for (int q=0; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += out_size;
            }
        }
    }
    
    // sgemm(int M, int N, int L, float* A, float* B, float* C)
    {
        //int M = outch;                    // outch
        int N = outw * outh;                // outsize or out stride
        int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i =  pp * 4;

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i+1);
            float* output2 = top_blob.channel(i+2);
            float* output3 = top_blob.channel(i+3);

            const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
            const float* biasptr = bias ? bias + i : zeros;

            int j=0;
            for (; j+3<N; j=j+4)
            {
                const float* vb = bottom_tm.channel(j/4);
                const float* va = kernel_tm.channel(i/4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(biasptr[0]);
                __m128 _sum1 = _mm_set1_ps(biasptr[1]);
                __m128 _sum2 = _mm_set1_ps(biasptr[2]);
                __m128 _sum3 = _mm_set1_ps(biasptr[3]);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a00-a03) * k30

                    // k1
                    _vb = _mm_loadu_ps(vb+4);
                    _va0 = _mm_set1_ps(va[4]);
                    _va1 = _mm_set1_ps(va[5]);
                    _va2 = _mm_set1_ps(va[6]);
                    _va3 = _mm_set1_ps(va[7]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a10-a13) * k01
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a10-a13) * k11
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a10-a13) * k21
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a10-a13) * k31

                    // k2
                    _vb = _mm_loadu_ps(vb+8);
                    _va0 = _mm_set1_ps(va[8]);
                    _va1 = _mm_set1_ps(va[9]);
                    _va2 = _mm_set1_ps(va[10]);
                    _va3 = _mm_set1_ps(va[11]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a20-a23) * k02
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a20-a23) * k12
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a20-a23) * k22
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a20-a23) * k32

                    // k3
                    _vb = _mm_loadu_ps(vb+12);
                    _va0 = _mm_set1_ps(va[12]);
                    _va1 = _mm_set1_ps(va[13]);
                    _va2 = _mm_set1_ps(va[14]);
                    _va3 = _mm_set1_ps(va[15]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a30-a33) * k03
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a30-a33) * k13
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a30-a33) * k23
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a30-a33) * k33

                    va += 16;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a00-a03) * k30
                    
                    va += 4;
                    vb += 4;
                }
                _mm_storeu_ps(output0, _sum0);
                _mm_storeu_ps(output1, _sum1);
                _mm_storeu_ps(output2, _sum2);
                _mm_storeu_ps(output3, _sum3);
#else
                float sum0[4] = {0};
                float sum1[4] = {0};
                float sum2[4] = {0};
                float sum3[4] = {0};
               
                int k=0;
                for (; k+7<L; k=k+8)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                        va += 4;

                        sum0[n] += va[0] * vb[n+4];
                        sum1[n] += va[1] * vb[n+4];
                        sum2[n] += va[2] * vb[n+4];
                        sum3[n] += va[3] * vb[n+4];
                        va += 4;

                        sum0[n] += va[0] * vb[n+8];
                        sum1[n] += va[1] * vb[n+8];
                        sum2[n] += va[2] * vb[n+8];
                        sum3[n] += va[3] * vb[n+8];
                        va += 4;

                        sum0[n] += va[0] * vb[n+12];
                        sum1[n] += va[1] * vb[n+12];
                        sum2[n] += va[2] * vb[n+12];
                        sum3[n] += va[3] * vb[n+12];
                        va += 4;

                        sum0[n] += va[0] * vb[n+16];
                        sum1[n] += va[1] * vb[n+16];
                        sum2[n] += va[2] * vb[n+16];
                        sum3[n] += va[3] * vb[n+16];
                        va += 4;

                        sum0[n] += va[0] * vb[n+20];
                        sum1[n] += va[1] * vb[n+20];
                        sum2[n] += va[2] * vb[n+20];
                        sum3[n] += va[3] * vb[n+20];
                        va += 4;

                        sum0[n] += va[0] * vb[n+24];
                        sum1[n] += va[1] * vb[n+24];
                        sum2[n] += va[2] * vb[n+24];
                        sum3[n] += va[3] * vb[n+24];
                        va += 4;

                        sum0[n] += va[0] * vb[n+28];
                        sum1[n] += va[1] * vb[n+28];
                        sum2[n] += va[2] * vb[n+28];
                        sum3[n] += va[3] * vb[n+28];
                        va -= 28;
                    }

                    va += 32;
                    vb += 32;
                }

                for (; k<L; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = sum0[n] + biasptr[0];
                    output1[n] = sum1[n] + biasptr[1];
                    output2[n] = sum2[n] + biasptr[2];
                    output3[n] = sum3[n] + biasptr[3];
                }
#endif // __SSE__
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                const float* vb = bottom_tm.channel(j/4 + j%4);
                const float* va = kernel_tm.channel(i/4);
#if __SSE__
                __m128 _sum0_3 = _mm_loadu_ps(biasptr);
                __m128 _sum0 = _mm_set1_ps(0.0);
                __m128 _sum1 = _mm_set1_ps(0.0);
                __m128 _sum2 = _mm_set1_ps(0.0);
                __m128 _sum3 = _mm_set1_ps(0.0);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _vb1 = _mm_set1_ps(vb[1]);
                    __m128 _vb2 = _mm_set1_ps(vb[2]);
                    __m128 _vb3 = _mm_set1_ps(vb[3]);
                    __m128 _va0 = _mm_loadu_ps(va);
                    __m128 _va1 = _mm_loadu_ps(va+4);
                    __m128 _va2 = _mm_loadu_ps(va+8);
                    __m128 _va3 = _mm_loadu_ps(va+12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_va0, _vb0));// sum0 += (k00-k30) * a00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_va1, _vb1));// sum1 += (k01-k31) * a10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_va2, _vb2));// sum2 += (k02-k32) * a20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_va3, _vb3));// sum3 += (k03-k33) * a30

                    va += 16;
                    vb += 4;
                }

                _sum0 = _mm_add_ps(_sum0, _sum1);
                _sum2 = _mm_add_ps(_sum2, _sum3);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum0);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum2);

                for (; k<L; k++)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _va = _mm_loadu_ps(va); 

                    _sum0_3 = _mm_add_ps(_sum0_3, _mm_mul_ps(_va, _vb0));// sum0 += (k00-k30) * a00

                    va += 4;
                    vb += 1;
                }         
                output0[0] = _sum0_3[0];
                output1[0] = _sum0_3[1];
                output2[0] = _sum0_3[2];
                output3[0] = _sum0_3[3];
#else
                float sum0 = biasptr[0];
                float sum1 = biasptr[1];
                float sum2 = biasptr[2];
                float sum3 = biasptr[3];

                for (int k=0; k<L; k++)
                {
                    sum0 += va[0] * vb[0];
                    sum1 += va[1] * vb[0];
                    sum2 += va[2] * vb[0];
                    sum3 += va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = sum0;
                output1[0] = sum1;
                output2[0] = sum2;
                output3[0] = sum3;
#endif // __SSE__
                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            int j=0;
            for (; j+3<N; j=j+4)
            {
                const float* vb = bottom_tm.channel(j/4);       
                const float* va = kernel_tm.channel(i/4 + i%4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(bias0);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    __m128 _vb0 = _mm_loadu_ps(vb);
                    __m128 _vb1 = _mm_loadu_ps(vb+4);
                    __m128 _vb2 = _mm_loadu_ps(vb+8);
                    __m128 _vb3 = _mm_loadu_ps(vb+12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0));// sum0 = (a00-a03) * k00                
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb1, _va1));// sum0 += (a10-a13) * k01
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb2, _va2));// sum0 += (a20-a23) * k02
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb3, _va3));// sum0 += (a30-a33) * k03
                
                    va += 4;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _vb0 = _mm_loadu_ps(vb);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0));    // sum0 = (a00-a03) * k00

                    va += 1;
                    vb += 4;
                }
                _mm_storeu_ps(output, _sum0); 
#else                
                float sum[4] = {0};

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                        sum[n] += va[1] * vb[n+4];
                        sum[n] += va[2] * vb[n+8];
                        sum[n] += va[3] * vb[n+12];
                        //sum[n] += va[4] * vb[n+16];
                        //sum[n] += va[5] * vb[n+20];
                        //sum[n] += va[6] * vb[n+24];
                        //sum[n] += va[7] * vb[n+28];
                    }

                    va += 4;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                    }

                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = sum[n] + bias0;
                }
#endif // __SSE__
                output += 4;
            }

            for (; j<N; j++)
            {
                const float* vb = bottom_tm.channel(j/4 + j%4);
                const float* va = kernel_tm.channel(i/4 + i%4);

                int k=0;
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(0.f);

                for (; k+3<L; k+=4)
                {
                    __m128 _p0 = _mm_loadu_ps(vb);
                    __m128 _k0 = _mm_loadu_ps(va);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_p0, _k0));

                    va += 4;
                    vb += 4;                    
                }
                float sum0 = bias0 + _sum0[0] + _sum0[1] + _sum0[2] + _sum0[3];
#else
                float sum0 = bias0;
#endif // __SSE__
                for (; k<L; k++)
                {
                    sum0 += va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = sum0;

                output++;
            }
        }
    }   
}